

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexPointCloudShape.cpp
# Opt level: O2

void __thiscall
btConvexPointCloudShape::batchedUnitVectorGetSupportingVertexWithoutMargin
          (btConvexPointCloudShape *this,btVector3 *vectors,btVector3 *supportVerticesOut,
          int numVectors)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  btVector3 bVar4;
  btScalar maxDot;
  btScalar local_44;
  btVector3 local_40;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)numVectors;
  if (numVectors < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
    local_40 = operator*((btVector3 *)((long)vectors->m_floats + uVar3),
                         (btVector3 *)
                         &(this->super_btPolyhedralConvexAabbCachingShape).
                          super_btPolyhedralConvexShape.super_btConvexInternalShape.
                          super_btConvexShape.super_btCollisionShape.field_0x1c);
    lVar1 = btVector3::maxDot(&local_40,this->m_unscaledPoints,(long)this->m_numPoints,&local_44);
    *(undefined4 *)((long)supportVerticesOut->m_floats + uVar3 + 0xc) = 0xdd5e0b6b;
    if (-1 < (int)lVar1) {
      bVar4 = getScaledPoint(this,(int)lVar1);
      *(btScalar (*) [4])((long)supportVerticesOut->m_floats + uVar3) = bVar4.m_floats;
      *(btScalar *)((long)supportVerticesOut->m_floats + uVar3 + 0xc) = local_44;
    }
  }
  return;
}

Assistant:

void	btConvexPointCloudShape::batchedUnitVectorGetSupportingVertexWithoutMargin(const btVector3* vectors,btVector3* supportVerticesOut,int numVectors) const
{
    for( int j = 0; j < numVectors; j++ )
    {
        const btVector3& vec = vectors[j] * m_localScaling;  // dot( a*c, b) = dot(a, b*c)
        btScalar maxDot;
        int index = (int) vec.maxDot( &m_unscaledPoints[0], m_numPoints, maxDot);
        supportVerticesOut[j][3] = btScalar(-BT_LARGE_FLOAT);
        if( 0 <= index )
        {
            //WARNING: don't swap next lines, the w component would get overwritten!
            supportVerticesOut[j] = getScaledPoint(index);
            supportVerticesOut[j][3] = maxDot;
        }
    }

}